

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  sqlite3_stmt *psVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint *p_00;
  Mem *pVal;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  size_t __n;
  byte *pbVar12;
  int iVar13;
  uint uVar14;
  uint *__s;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  sqlite3_stmt *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pRC == 0) {
    iVar8 = p->nColumn;
    iVar6 = sqlite3_initialize();
    if (iVar6 == 0) {
      uVar1 = (long)iVar8 + 2;
      p_00 = (uint *)sqlite3Malloc(uVar1 * 0xe);
      if (p_00 != (uint *)0x0) {
        local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
        iVar6 = fts3SqlStmt(p,0x16,&local_48,(sqlite3_value **)0x0);
        psVar4 = local_48;
        if (iVar6 == 0) {
          uVar17 = 0;
          sqlite3_bind_int64(local_48,1,0);
          iVar6 = sqlite3_step(psVar4);
          if (iVar6 == 100) {
            pVal = columnMem(psVar4,0);
            pvVar9 = sqlite3_value_blob(pVal);
            columnMallocFailure(psVar4);
            iVar6 = sqlite3_column_bytes(psVar4,0);
            if (((iVar6 != 0) && (-1 < *(char *)((long)pvVar9 + (long)iVar6 + -1))) &&
               (0 < iVar6 && -2 < iVar8)) {
              uVar17 = 0;
              iVar13 = 0;
              do {
                local_40 = &DAT_aaaaaaaaaaaaaaaa;
                iVar7 = sqlite3Fts3GetVarintU
                                  ((char *)((long)iVar13 + (long)pvVar9),(sqlite_uint64 *)&local_40)
                ;
                p_00[uVar17] = (uint)local_40;
                uVar17 = uVar17 + 1;
                if ((uVar1 & 0xffffffff) <= uVar17) break;
                iVar13 = iVar13 + iVar7;
              } while (iVar13 < iVar6);
            }
            if ((int)(uint)uVar17 < (int)uVar1) {
              __n = (ulong)(~(uint)uVar17 + (int)uVar1) * 4 + 4;
              __s = p_00 + (uVar17 & 0xffffffff);
              goto LAB_001ce93f;
            }
          }
          else {
            __n = uVar1 * 4;
            __s = p_00;
LAB_001ce93f:
            memset(__s,0,__n);
          }
          iVar6 = sqlite3_reset(psVar4);
          if (iVar6 == 0) {
            uVar14 = *p_00 + nChng;
            uVar16 = uVar14;
            if (*p_00 < (uint)-nChng) {
              uVar16 = 0;
            }
            if (-1 < nChng) {
              uVar16 = uVar14;
            }
            *p_00 = uVar16;
            if (-1 < p->nColumn) {
              lVar10 = -1;
              do {
                uVar16 = (aSzIns[lVar10 + 1] + p_00[lVar10 + 2]) - aSzDel[lVar10 + 1];
                if (aSzIns[lVar10 + 1] + p_00[lVar10 + 2] < aSzDel[lVar10 + 1]) {
                  uVar16 = 0;
                }
                p_00[lVar10 + 2] = uVar16;
                lVar10 = lVar10 + 1;
              } while (lVar10 < p->nColumn);
            }
            uVar17 = 0;
            if (-2 < iVar8) {
              uVar11 = 0;
              do {
                pbVar5 = (byte *)((long)(int)uVar17 + (long)(p_00 + uVar1));
                uVar15 = (ulong)p_00[uVar11];
                do {
                  pbVar12 = pbVar5;
                  bVar3 = (byte)uVar15;
                  *pbVar12 = bVar3 | 0x80;
                  uVar16 = (int)uVar17 + 1;
                  uVar17 = (ulong)uVar16;
                  bVar2 = 0x7f < uVar15;
                  pbVar5 = pbVar12 + 1;
                  uVar15 = uVar15 >> 7;
                } while (bVar2);
                *pbVar12 = bVar3;
                uVar11 = uVar11 + 1;
              } while (uVar11 != (uVar1 & 0xffffffff));
              uVar17 = (ulong)(int)uVar16;
            }
            iVar8 = fts3SqlStmt(p,0x17,&local_48,(sqlite3_value **)0x0);
            psVar4 = local_48;
            if (iVar8 == 0) {
              sqlite3_bind_int64(local_48,1,0);
              bindText(psVar4,2,p_00 + uVar1,uVar17,(_func_void_void_ptr *)0x0,'\0');
              sqlite3_step(psVar4);
              iVar8 = sqlite3_reset(psVar4);
              *pRC = iVar8;
              sqlite3_bind_null(psVar4,2);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                sqlite3_free(p_00);
                return;
              }
              goto LAB_001cead2;
            }
            sqlite3_free(p_00);
            *pRC = iVar8;
            goto LAB_001ce962;
          }
        }
        sqlite3_free(p_00);
        *pRC = iVar6;
        goto LAB_001ce962;
      }
    }
    *pRC = 7;
  }
LAB_001ce962:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001cead2:
  __stack_chk_fail();
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}